

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O1

FT_Error T1_Parse_Glyph_And_Get_Char_String
                   (T1_Decoder_conflict decoder,FT_UInt glyph_index,FT_Data *char_string,
                   FT_Bool *force_scaling)

{
  FT_Face pFVar1;
  FT_String *pFVar2;
  long lVar3;
  FT_Incremental_InterfaceRec *pFVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  FT_ListNode pFVar8;
  FT_Stream pFVar9;
  int iVar10;
  FT_Fixed FVar11;
  undefined1 local_a00 [8];
  CFF_SubFontRec subfont;
  PS_Decoder psdecoder;
  
  pFVar1 = (decoder->builder).face;
  pFVar2 = pFVar1[3].family_name;
  lVar3 = *(long *)(pFVar2 + 0x18);
  pFVar4 = pFVar1->internal->incremental_interface;
  pFVar8 = pFVar1[2].sizes_list.tail;
  (decoder->font_matrix).yx = (FT_Fixed)pFVar1[2].sizes_list.head;
  (decoder->font_matrix).yy = (FT_Fixed)pFVar8;
  pFVar9 = pFVar1[2].stream;
  (decoder->font_matrix).xx = (FT_Fixed)pFVar1[2].memory;
  (decoder->font_matrix).xy = (FT_Fixed)pFVar9;
  uVar5 = *(undefined4 *)((long)&pFVar1[2].autohint.data + 4);
  uVar6 = *(undefined4 *)&pFVar1[2].autohint.finalizer;
  uVar7 = *(undefined4 *)((long)&pFVar1[2].autohint.finalizer + 4);
  *(undefined4 *)&(decoder->font_offset).x = *(undefined4 *)&pFVar1[2].autohint.data;
  *(undefined4 *)((long)&(decoder->font_offset).x + 4) = uVar5;
  *(undefined4 *)&(decoder->font_offset).y = uVar6;
  *(undefined4 *)((long)&(decoder->font_offset).y + 4) = uVar7;
  if (pFVar4 == (FT_Incremental_InterfaceRec *)0x0) {
    char_string->pointer = (FT_Byte *)(&(pFVar1[2].size)->face)[glyph_index];
    char_string->length = *(FT_Int *)((long)&(pFVar1[2].charmap)->face + (ulong)glyph_index * 4);
    iVar10 = 0;
  }
  else {
    iVar10 = (*pFVar4->funcs->get_glyph_data)(pFVar4->object,glyph_index,char_string);
  }
  if (iVar10 == 0) {
    if ((decoder->builder).metrics_only == '\0') {
      (**(code **)(pFVar2 + 0x30))(&subfont.random,decoder,1);
      (**(code **)(pFVar2 + 0x38))(pFVar1,&pFVar1[1].available_sizes,local_a00);
      iVar10 = (**(code **)(lVar3 + 0x18))
                         (&subfont.random,char_string->pointer,(long)char_string->length);
      if ((char)iVar10 == -0x5c) {
        *(undefined1 *)&(decoder->builder).glyph[1].library = 0;
        *force_scaling = '\x01';
        iVar10 = (**(code **)(lVar3 + 0x18))
                           (&subfont.random,char_string->pointer,(long)char_string->length);
      }
    }
    else {
      iVar10 = (**(code **)(lVar3 + 0x10))(decoder,char_string->pointer,char_string->length);
    }
  }
  if ((pFVar4 != (FT_Incremental_InterfaceRec *)0x0) && (iVar10 == 0)) {
    if (pFVar4->funcs->get_glyph_metrics == (FT_Incremental_GetGlyphMetricsFunc)0x0) {
      iVar10 = 0;
    }
    else {
      FVar11 = FT_RoundFix((decoder->builder).left_bearing.x);
      local_a00 = (undefined1  [8])(FVar11 >> 0x10);
      subfont.font_dict.version = 0;
      subfont.font_dict.notice = 0;
      FVar11 = FT_RoundFix((decoder->builder).advance.x);
      subfont.font_dict._8_8_ = FVar11 >> 0x10;
      FVar11 = FT_RoundFix((decoder->builder).advance.y);
      subfont.font_dict._16_8_ = FVar11 >> 0x10;
      iVar10 = (*pFVar4->funcs->get_glyph_metrics)
                         (pFVar4->object,glyph_index,'\0',(FT_Incremental_MetricsRec *)local_a00);
      (decoder->builder).left_bearing.x = (long)local_a00 << 0x10;
      (decoder->builder).advance.x = subfont.font_dict._8_8_ << 0x10;
      (decoder->builder).advance.y = subfont.font_dict._16_8_ << 0x10;
    }
  }
  return iVar10;
}

Assistant:

static FT_Error
  T1_Parse_Glyph_And_Get_Char_String( T1_Decoder  decoder,
                                      FT_UInt     glyph_index,
                                      FT_Data*    char_string,
                                      FT_Bool*    force_scaling )
  {
    T1_Face   face  = (T1_Face)decoder->builder.face;
    T1_Font   type1 = &face->type1;
    FT_Error  error = FT_Err_Ok;

    PSAux_Service           psaux         = (PSAux_Service)face->psaux;
    const T1_Decoder_Funcs  decoder_funcs = psaux->t1_decoder_funcs;
    PS_Decoder              psdecoder;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec *inc =
                      face->root.internal->incremental_interface;
#endif

#ifdef T1_CONFIG_OPTION_OLD_ENGINE
    PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );
#endif

    decoder->font_matrix = type1->font_matrix;
    decoder->font_offset = type1->font_offset;

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( inc )
      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, char_string );
    else

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    /* For ordinary fonts get the character data stored in the face record. */
    {
      char_string->pointer = type1->charstrings[glyph_index];
      char_string->length  = (FT_Int)type1->charstrings_len[glyph_index];
    }

    if ( !error )
    {
      /* choose which renderer to use */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
      if ( driver->hinting_engine == FT_HINTING_FREETYPE ||
           decoder->builder.metrics_only                 )
        error = decoder_funcs->parse_charstrings_old(
                  decoder,
                  (FT_Byte*)char_string->pointer,
                  (FT_UInt)char_string->length );
#else
      if ( decoder->builder.metrics_only )
        error = decoder_funcs->parse_metrics(
                  decoder,
                  (FT_Byte*)char_string->pointer,
                  (FT_UInt)char_string->length );
#endif
      else
      {
        CFF_SubFontRec  subfont;


        psaux->ps_decoder_init( &psdecoder, decoder, TRUE );

        psaux->t1_make_subfont( FT_FACE( face ),
                                &face->type1.private_dict, &subfont );
        psdecoder.current_subfont = &subfont;

        error = decoder_funcs->parse_charstrings(
                  &psdecoder,
                  (FT_Byte*)char_string->pointer,
                  (FT_ULong)char_string->length );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          ((T1_GlyphSlot)decoder->builder.glyph)->hint = FALSE;

          *force_scaling = TRUE;

          error = decoder_funcs->parse_charstrings(
                    &psdecoder,
                    (FT_Byte*)char_string->pointer,
                    (FT_ULong)char_string->length );
        }
      }
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error && inc && inc->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = FIXED_TO_INT( decoder->builder.left_bearing.x );
      metrics.bearing_y = 0;
      metrics.advance   = FIXED_TO_INT( decoder->builder.advance.x );
      metrics.advance_v = FIXED_TO_INT( decoder->builder.advance.y );

      error = inc->funcs->get_glyph_metrics( inc->object,
                                             glyph_index, FALSE, &metrics );

      decoder->builder.left_bearing.x = INT_TO_FIXED( metrics.bearing_x );
      decoder->builder.advance.x      = INT_TO_FIXED( metrics.advance );
      decoder->builder.advance.y      = INT_TO_FIXED( metrics.advance_v );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    return error;
  }